

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O0

void __thiscall
google::protobuf::MutableRepeatedFieldRef<proto2_unittest::ForeignMessage,void>::
MergeFrom<google::protobuf::RepeatedFieldRef<proto2_unittest::ForeignMessage,void>>
          (MutableRepeatedFieldRef<proto2_unittest::ForeignMessage,void> *this,
          RepeatedFieldRef<proto2_unittest::ForeignMessage,_void> *container)

{
  bool bVar1;
  IteratorValueType value;
  iterator local_58;
  undefined1 local_38 [8];
  Iterator it;
  RepeatedFieldRef<proto2_unittest::ForeignMessage,_void> *container_local;
  MutableRepeatedFieldRef<proto2_unittest::ForeignMessage,_void> *this_local;
  
  it.scratch_space_._M_t.
  super___uniq_ptr_impl<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>.
  _M_t.
  super__Tuple_impl<0UL,_google::protobuf::Message_*,_std::default_delete<google::protobuf::Message>_>
  .super__Head_base<0UL,_google::protobuf::Message_*,_false>._M_head_impl =
       (__uniq_ptr_data<google::protobuf::Message,_std::default_delete<google::protobuf::Message>,_true,_true>
        )(__uniq_ptr_data<google::protobuf::Message,_std::default_delete<google::protobuf::Message>,_true,_true>
          )container;
  RepeatedFieldRef<proto2_unittest::ForeignMessage,_void>::begin((iterator *)local_38,container);
  while( true ) {
    RepeatedFieldRef<proto2_unittest::ForeignMessage,_void>::end
              (&local_58,
               (RepeatedFieldRef<proto2_unittest::ForeignMessage,_void> *)
               it.scratch_space_._M_t.
               super___uniq_ptr_impl<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::Message_*,_std::default_delete<google::protobuf::Message>_>
               .super__Head_base<0UL,_google::protobuf::Message_*,_false>._M_head_impl);
    bVar1 = internal::RepeatedFieldRefIterator<proto2_unittest::ForeignMessage>::operator!=
                      ((RepeatedFieldRefIterator<proto2_unittest::ForeignMessage> *)local_38,
                       &local_58);
    internal::RepeatedFieldRefIterator<proto2_unittest::ForeignMessage>::~RepeatedFieldRefIterator
              (&local_58);
    if (!bVar1) break;
    value = internal::RepeatedFieldRefIterator<proto2_unittest::ForeignMessage>::operator*
                      ((RepeatedFieldRefIterator<proto2_unittest::ForeignMessage> *)local_38);
    MutableRepeatedFieldRef<proto2_unittest::ForeignMessage,_void>::Add
              ((MutableRepeatedFieldRef<proto2_unittest::ForeignMessage,_void> *)this,value);
    internal::RepeatedFieldRefIterator<proto2_unittest::ForeignMessage>::operator++
              ((RepeatedFieldRefIterator<proto2_unittest::ForeignMessage> *)local_38);
  }
  internal::RepeatedFieldRefIterator<proto2_unittest::ForeignMessage>::~RepeatedFieldRefIterator
            ((RepeatedFieldRefIterator<proto2_unittest::ForeignMessage> *)local_38);
  return;
}

Assistant:

void MergeFrom(const Container& container) const {
    typedef typename Container::const_iterator Iterator;
    for (Iterator it = container.begin(); it != container.end(); ++it) {
      Add(*it);
    }
  }